

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::internal::SooRep::set_non_soo
          (SooRep *this,bool was_soo,int capacity,void *elements)

{
  string *psVar1;
  size_type sVar2;
  undefined8 uVar3;
  pointer pcVar4;
  bool local_31;
  void *local_30;
  void *local_28 [2];
  unsigned_long local_18;
  
  local_28[0] = (void *)CONCAT71(local_28[0]._1_7_,
                                 (undefined1  [16])
                                 ((undefined1  [16])this->field_0 & (undefined1  [16])0x4) ==
                                 (undefined1  [16])0x0);
  local_31 = was_soo;
  local_30 = elements;
  psVar1 = absl::lts_20240722::log_internal::Check_EQImpl<bool,bool>
                     (&local_31,(bool *)local_28,"was_soo == is_soo()");
  if (psVar1 == (string *)0x0) {
    local_28[0] = (void *)0x0;
    psVar1 = absl::lts_20240722::log_internal::Check_NEImpl<void*,decltype(nullptr)>
                       (&local_30,local_28,"elements != nullptr");
    if (psVar1 == (string *)0x0) {
      local_28[0] = (void *)(ulong)((uint)local_30 & 7);
      local_18 = 0;
      psVar1 = absl::lts_20240722::log_internal::Check_EQImpl<unsigned_long,unsigned_long>
                         ((unsigned_long *)local_28,&local_18,
                          "reinterpret_cast<uintptr_t>(elements) % kSooPtrAlignment == uintptr_t{0}"
                         );
      if (psVar1 == (string *)0x0) {
        if (local_31 != false) {
          (this->field_0).long_rep.size = *(uint *)&this->field_0 & 3;
        }
        (this->field_0).long_rep.capacity = capacity;
        (this->field_0).long_rep.elements_int = (ulong)local_30 | 4;
        return;
      }
      pcVar4 = (psVar1->_M_dataplus)._M_p;
      sVar2 = psVar1->_M_string_length;
      uVar3 = 0xdf;
    }
    else {
      pcVar4 = (psVar1->_M_dataplus)._M_p;
      sVar2 = psVar1->_M_string_length;
      uVar3 = 0xdd;
    }
  }
  else {
    pcVar4 = (psVar1->_M_dataplus)._M_p;
    sVar2 = psVar1->_M_string_length;
    uVar3 = 0xdc;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
             ,uVar3,sVar2,pcVar4);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_28);
}

Assistant:

void set_non_soo(bool was_soo, int capacity, void* elements) {
    ABSL_DCHECK_EQ(was_soo, is_soo());
    ABSL_DCHECK_NE(elements, nullptr);
    ABSL_DCHECK_EQ(reinterpret_cast<uintptr_t>(elements) % kSooPtrAlignment,
                   uintptr_t{0});
    if (was_soo) long_rep.size = short_rep.size();
    long_rep.capacity = capacity;
    long_rep.elements_int = reinterpret_cast<uintptr_t>(elements) | kNotSooBit;
  }